

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O1

int CVodeGetLinWorkSpace(void *cvode_mem,long *lenrwLS,long *leniwLS)

{
  SUNMatrix A;
  int iVar1;
  int iVar2;
  long liw;
  long lrw;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  sunindextype liw1;
  sunindextype lrw1;
  long local_50;
  long local_48;
  CVLsMem local_40;
  CVodeMem local_38;
  int local_30;
  int local_2c;
  
  iVar1 = cvLs_AccessLMem(cvode_mem,"CVodeGetLinWorkSpace",&local_38,&local_40);
  if (iVar1 == 0) {
    *lenrwLS = 2;
    *leniwLS = 0x1e;
    if (local_38->cv_tempv->ops->nvspace !=
        (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
      N_VSpace(local_38->cv_tempv,&local_2c,&local_30);
      *lenrwLS = *lenrwLS + (long)local_2c * 2;
      *leniwLS = *leniwLS + (long)local_30 * 2;
    }
    A = local_40->savedJ;
    if ((A != (SUNMatrix)0x0) && (A->ops->space != (_func_int_SUNMatrix_long_ptr_long_ptr *)0x0)) {
      iVar1 = SUNMatSpace(A,&local_48,&local_50);
      if (iVar1 == 0) {
        *lenrwLS = *lenrwLS + local_48;
        *leniwLS = *leniwLS + local_50;
      }
    }
    iVar1 = 0;
    if (local_40->LS->ops->space != (_func_int_SUNLinearSolver_long_ptr_long_ptr *)0x0) {
      iVar2 = SUNLinSolSpace(local_40->LS,&local_48,&local_50);
      if (iVar2 == 0) {
        *lenrwLS = *lenrwLS + local_48;
        *leniwLS = *leniwLS + local_50;
      }
    }
  }
  return iVar1;
}

Assistant:

int CVodeGetLinWorkSpace(void *cvode_mem, long int *lenrwLS,
                         long int *leniwLS)
{
  CVodeMem     cv_mem;
  CVLsMem      cvls_mem;
  sunindextype lrw1, liw1;
  long int     lrw, liw;
  int          retval;

  /* access CVLsMem structure */
  retval = cvLs_AccessLMem(cvode_mem, "CVodeGetLinWorkSpace",
                           &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS)  return(retval);

  /* start with fixed sizes plus vector/matrix pointers */
  *lenrwLS = 2;
  *leniwLS = 30;

  /* add NVector sizes */
  if (cv_mem->cv_tempv->ops->nvspace) {
    N_VSpace(cv_mem->cv_tempv, &lrw1, &liw1);
    *lenrwLS += 2*lrw1;
    *leniwLS += 2*liw1;
  }

  /* add SUNMatrix size (only account for the one owned by Ls interface) */
  if (cvls_mem->savedJ)
    if (cvls_mem->savedJ->ops->space) {
      retval = SUNMatSpace(cvls_mem->savedJ, &lrw, &liw);
      if (retval == 0) {
        *lenrwLS += lrw;
        *leniwLS += liw;
      }
    }

  /* add LS sizes */
  if (cvls_mem->LS->ops->space) {
    retval = SUNLinSolSpace(cvls_mem->LS, &lrw, &liw);
    if (retval == 0) {
      *lenrwLS += lrw;
      *leniwLS += liw;
    }
  }

  return(CVLS_SUCCESS);
}